

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Uint32 anon_unknown.dwarf_73f79::equationToGlConstant(Equation blendEquation)

{
  ostream *poVar1;
  int in_EDI;
  Uint32 local_4;
  
  if (in_EDI == 0) {
    local_4 = 0x8006;
  }
  else if (in_EDI == 1) {
    local_4 = 0x800a;
  }
  else {
    if (in_EDI != 2) {
      poVar1 = sf::err();
      poVar1 = std::operator<<(poVar1,
                               "Invalid value for sf::BlendMode::Equation! Fallback to sf::BlendMode::Add."
                              );
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                    ,0x77,
                    "sf::Uint32 (anonymous namespace)::equationToGlConstant(sf::BlendMode::Equation)"
                   );
    }
    local_4 = 0x800b;
  }
  return local_4;
}

Assistant:

sf::Uint32 equationToGlConstant(sf::BlendMode::Equation blendEquation)
    {
        switch (blendEquation)
        {
            case sf::BlendMode::Add:             return GLEXT_GL_FUNC_ADD;
            case sf::BlendMode::Subtract:        return GLEXT_GL_FUNC_SUBTRACT;
            case sf::BlendMode::ReverseSubtract: return GLEXT_GL_FUNC_REVERSE_SUBTRACT;
        }

        sf::err() << "Invalid value for sf::BlendMode::Equation! Fallback to sf::BlendMode::Add." << std::endl;
        assert(false);
        return GLEXT_GL_FUNC_ADD;
    }